

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O1

void __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::reserve(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *this,size_type non_zeros,bool preserve)

{
  size_type sVar1;
  ulong uVar2;
  pointer puVar3;
  size_type sVar4;
  pointer pdVar5;
  size_type sVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  double *pdVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  undefined7 in_register_00000011;
  long lVar12;
  unsigned_long *__s;
  double *__s_00;
  ulong __n;
  
  __n = non_zeros + (non_zeros == 0);
  uVar10 = this->size_;
  sVar1 = (this->index_data_).size_;
  if (uVar10 < __n) {
    __n = uVar10;
  }
  this->capacity_ = __n;
  if ((int)CONCAT71(in_register_00000011,preserve) == 0) {
    if (sVar1 != __n) {
      puVar3 = (this->index_data_).data_;
      if (uVar10 != 0) {
        puVar8 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                           ((new_allocator<unsigned_long> *)&this->index_data_,__n,(void *)0x0);
        (this->index_data_).data_ = puVar8;
      }
      sVar1 = (this->index_data_).size_;
      if (sVar1 != 0) {
        operator_delete(puVar3,sVar1 << 3);
      }
      if (uVar10 == 0) {
        (this->index_data_).data_ = (pointer)0x0;
      }
      (this->index_data_).size_ = __n;
    }
    sVar4 = this->capacity_;
    if ((this->value_data_).size_ != sVar4) {
      pdVar5 = (this->value_data_).data_;
      if (sVar4 != 0) {
        pdVar9 = __gnu_cxx::new_allocator<double>::allocate
                           ((new_allocator<double> *)&this->value_data_,sVar4,(void *)0x0);
        (this->value_data_).data_ = pdVar9;
      }
      sVar6 = (this->value_data_).size_;
      if (sVar6 != 0) {
        operator_delete(pdVar5,sVar6 << 3);
      }
      if (sVar4 == 0) {
        (this->value_data_).data_ = (pointer)0x0;
      }
      (this->value_data_).size_ = sVar4;
    }
    this->filled_ = 0;
  }
  else {
    if (sVar1 != __n) {
      puVar8 = (this->index_data_).data_;
      if (uVar10 != 0) {
        puVar7 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                           ((new_allocator<unsigned_long> *)&this->index_data_,__n,(void *)0x0);
        (this->index_data_).data_ = puVar7;
        uVar2 = (this->index_data_).size_;
        if (__n < uVar2) {
          lVar12 = 0;
          do {
            *(undefined8 *)((long)puVar7 + lVar12) = *(undefined8 *)((long)puVar8 + lVar12);
            lVar12 = lVar12 + 8;
          } while (__n * 8 - lVar12 != 0);
        }
        else {
          puVar11 = puVar8;
          __s = puVar7;
          if (uVar2 != 0) {
            do {
              *__s = *puVar11;
              __s = __s + 1;
              puVar11 = puVar11 + 1;
            } while (puVar11 != puVar8 + (this->index_data_).size_);
          }
          if (__s != puVar7 + __n) {
            memset(__s,0,((long)(puVar7 + __n) + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
          }
        }
      }
      sVar1 = (this->index_data_).size_;
      if (sVar1 != 0) {
        operator_delete(puVar8,sVar1 << 3);
      }
      if (uVar10 == 0) {
        (this->index_data_).data_ = (pointer)0x0;
      }
      (this->index_data_).size_ = __n;
    }
    sVar4 = this->capacity_;
    if ((this->value_data_).size_ != sVar4) {
      pdVar5 = (this->value_data_).data_;
      if (sVar4 != 0) {
        pdVar9 = __gnu_cxx::new_allocator<double>::allocate
                           ((new_allocator<double> *)&this->value_data_,sVar4,(void *)0x0);
        (this->value_data_).data_ = pdVar9;
        uVar10 = (this->value_data_).size_;
        if (sVar4 < uVar10) {
          lVar12 = 0;
          do {
            *(undefined8 *)((long)pdVar9 + lVar12) = *(undefined8 *)((long)pdVar5 + lVar12);
            lVar12 = lVar12 + 8;
          } while (sVar4 * 8 - lVar12 != 0);
        }
        else {
          __s_00 = pdVar9;
          if (uVar10 != 0) {
            lVar12 = 0;
            do {
              *(undefined8 *)((long)pdVar9 + lVar12) = *(undefined8 *)((long)pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (uVar10 << 3 != lVar12);
            __s_00 = (double *)(lVar12 + (long)pdVar9);
          }
          if (__s_00 != pdVar9 + sVar4) {
            memset(__s_00,0,((long)(pdVar9 + sVar4) + (-8 - (long)__s_00) & 0xfffffffffffffff8U) + 8
                  );
          }
        }
      }
      sVar6 = (this->value_data_).size_;
      if (sVar6 != 0) {
        operator_delete(pdVar5,sVar6 << 3);
      }
      if (sVar4 == 0) {
        (this->value_data_).data_ = (pointer)0x0;
      }
      (this->value_data_).size_ = sVar4;
    }
    uVar10 = this->capacity_;
    if (this->filled_ < this->capacity_) {
      uVar10 = this->filled_;
    }
    this->filled_ = uVar10;
  }
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        void reserve (size_type non_zeros, bool preserve = true) {
            capacity_ = restrict_capacity (non_zeros);
            if (preserve) {
                index_data_. resize (capacity_, size_type ());
                value_data_. resize (capacity_, value_type ());
                filled_ = (std::min) (capacity_, filled_);
            }
            else {
                index_data_. resize (capacity_);
                value_data_. resize (capacity_);
                filled_ = 0;
            }
            storage_invariants ();
        }